

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_bset_8_r_al(void)

{
  uint address;
  uint uVar1;
  uint uVar2;
  uint mask;
  uint src;
  uint ea;
  
  address = m68ki_read_imm_32();
  uVar1 = m68ki_read_8_fc(address,m68ki_cpu.s_flag | m68ki_address_space);
  uVar2 = 1 << ((byte)m68ki_cpu.dar[m68ki_cpu.ir >> 9 & 7] & 7);
  m68ki_cpu.not_z_flag = uVar1 & uVar2;
  m68ki_write_8_fc(address,m68ki_cpu.s_flag | 1,uVar1 | uVar2);
  return;
}

Assistant:

static void m68k_op_bset_8_r_al(void)
{
	uint ea = EA_AL_8();
	uint src = m68ki_read_8(ea);
	uint mask = 1 << (DX & 7);

	FLAG_Z = src & mask;
	m68ki_write_8(ea, src | mask);
}